

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O2

string * __thiscall
t_java_generator::async_function_call_arglist_abi_cxx11_
          (string *__return_storage_ptr__,t_java_generator *this,t_function *tfunc,
          bool use_base_method,bool include_types)

{
  t_struct *tstruct;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_48);
  tstruct = tfunc->arglist_;
  if ((tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    argument_list_abi_cxx11_(&local_68,this,tstruct,include_types);
    std::operator+(&local_48,&local_68,", ");
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
  }
  if (include_types) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    type_name_abi_cxx11_(&local_68,this,tfunc->returntype_,true,false,false,false);
    std::operator+(&local_48,&local_68,"> ");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string t_java_generator::async_function_call_arglist(t_function* tfunc,
                                                     bool use_base_method,
                                                     bool include_types) {
  (void)use_base_method;
  std::string arglist = "";
  if (tfunc->get_arglist()->get_members().size() > 0) {
    arglist = argument_list(tfunc->get_arglist(), include_types) + ", ";
  }

  if (include_types) {
    arglist += "org.apache.thrift.async.AsyncMethodCallback<";
    arglist += type_name(tfunc->get_returntype(), true) + "> ";
  }
  arglist += "resultHandler";

  return arglist;
}